

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O3

boolean replay_run_cmdloop(boolean optonly,boolean singlestep,boolean fast)

{
  byte bVar1;
  nh_option_desc *pnVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  byte *__ptr;
  byte *pbVar7;
  char *pcVar8;
  memfile_tag *pmVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  undefined7 in_register_00000011;
  long lVar14;
  char *in;
  ulong uVar15;
  char cVar16;
  char cVar17;
  int iVar18;
  ulong uVar19;
  undefined7 in_register_00000031;
  memfile_tag *pmVar20;
  undefined7 in_register_00000039;
  uint uVar21;
  bool bVar22;
  nh_cmd_arg cmdarg;
  int count;
  char valbuf [256];
  char optname [256];
  nh_cmd_arg local_2128;
  byte *local_2120;
  uint local_2114;
  nh_optvalue local_2110;
  uint local_2108;
  undefined4 local_2104;
  undefined4 local_2100;
  int local_20fc;
  memfile_tag local_20f8 [10];
  memfile local_1ff8;
  
  pnVar2 = birth_options;
  local_2104 = (undefined4)CONCAT71(in_register_00000031,singlestep);
  uVar19 = CONCAT71(in_register_00000039,optonly) & 0xffffffff;
  birth_options = active_birth_options;
  active_birth_options = pnVar2;
  pcVar6 = next_log_token();
  if (pcVar6 != (char *)0x0) {
    local_2100 = (undefined4)CONCAT71(in_register_00000011,fast);
    __ptr = (byte *)strdup(pcVar6);
    if (__ptr != (byte *)0x0) {
      cVar16 = (char)uVar19;
      bVar22 = (char)local_2104 != '\0';
      uVar21 = 0;
      local_2114 = (uint)CONCAT71(in_register_00000039,optonly);
      do {
        bVar3 = *__ptr;
        cVar17 = (char)uVar19;
        if (bVar3 < 0x3e) {
          if (bVar3 != 0x21) {
            if (bVar3 == 0x2d) {
              if (((cVar17 == '\0') && (program_state.viewing != 0)) &&
                 (loginfo.cmds_are_invalid != '\0')) {
                if (__ptr[1] != 0x2d) {
                  parse_error("Error: incorrect message format");
                }
                iVar4 = base64_strlen((char *)(__ptr + 2));
                pcVar6 = (char *)calloc(1,(long)(iVar4 + 2));
                base64_decode((char *)(__ptr + 2),pcVar6);
                pline("%s",pcVar6);
                free(pcVar6);
              }
            }
            else if (((bVar3 == 0x3c) && (cVar17 == '\0')) && (loginfo.cmds_are_invalid == '\0')) {
              iVar4 = __isoc99_sscanf(__ptr,"<%x",&local_1ff8);
              if (iVar4 != 1) {
                parse_error("Error: incorrect command result specification\n");
              }
              uVar10 = (uint)local_1ff8.buf;
              uVar5 = mt_nextstate();
              if (uVar10 != (uVar5 & 0xffff)) {
                loginfo.cmds_are_invalid = '\x01';
                raw_printf(
                          "The recorded commands seem to be invalid.  Replay will use diffs instead."
                          );
              }
            }
            goto LAB_001baa2c;
          }
          pcVar6 = strchr((char *)(__ptr + 1),0x3a);
          if (pcVar6 == (char *)0x0) {
LAB_001bac1f:
            terminate();
          }
          *pcVar6 = '\0';
          pcVar8 = strchr(pcVar6 + 1,0x3a);
          if (pcVar8 == (char *)0x0) goto LAB_001bac1f;
          in = pcVar8 + 1;
          *pcVar8 = '\0';
          base64_decode((char *)(__ptr + 1),(char *)&local_1ff8);
          uVar10 = local_2114;
          cVar17 = pcVar6[1];
          switch(cVar17) {
          case 'a':
            iVar4 = base64_strlen(in);
            pcVar6 = (char *)calloc((long)(iVar4 + 1),1);
            base64_decode(in,pcVar6);
            local_2110.ar = parse_autopickup_rules(pcVar6);
            free(pcVar6);
            break;
          case 'b':
            iVar4 = atoi(in);
            local_2110.b = (char)iVar4;
            break;
          case 'c':
          case 'd':
          case 'f':
          case 'g':
          case 'h':
switchD_001ba672_caseD_63:
            parse_error("Unrecognized option type");
          case 'e':
            pcVar6 = "%x";
            goto LAB_001ba910;
          case 'i':
            pcVar6 = "%d";
LAB_001ba910:
            __isoc99_sscanf(in,pcVar6,&local_2110);
            break;
          default:
            if (cVar17 == 'm') {
              iVar4 = base64_strlen(in);
              pcVar6 = (char *)calloc((long)(iVar4 + 1),1);
              base64_decode(in,pcVar6);
              local_2110.mt = parse_msgtype_rules(pcVar6);
              free(pcVar6);
            }
            else {
              if (cVar17 != 's') goto switchD_001ba672_caseD_63;
              base64_decode(in,(char *)local_20f8);
              local_2110.s = (char *)0x0;
              if ((char)local_20f8[0].next != '\0') {
                local_2110.s = (char *)local_20f8;
              }
            }
          }
          uVar19 = (ulong)uVar10;
          nh_set_option((char *)&local_1ff8,local_2110,'\0');
        }
        else {
          if (bVar3 == 0x3e) {
            if (loginfo.cmds_are_invalid == '\0' && cVar17 == '\0') {
              iVar4 = __isoc99_sscanf(__ptr,">%n",local_20f8);
              if ((iVar4 == -1) || ((int)local_20f8[0].next == 0)) {
LAB_001bac13:
                parse_error("Error: Incorrect command spec\n");
              }
              local_1ff8.buf = (char *)((ulong)local_1ff8.buf & 0xffffffff00000000);
              iVar4 = __isoc99_sscanf(__ptr + (int)local_20f8[0].next,"%llx%n",&turntime,&local_1ff8
                                     );
              if ((iVar4 < 1) || ((uint)local_1ff8.buf == 0)) goto LAB_001bac13;
              lVar14 = (long)(int)local_20f8[0].next;
              local_20f8[0].next._0_4_ = (int)(lVar14 + (int)(uint)local_1ff8.buf);
              iVar4 = __isoc99_sscanf(__ptr + lVar14 + (int)(uint)local_1ff8.buf,":%x:%d",
                                      &local_1ff8,&local_20fc);
              if (iVar4 < 2) goto LAB_001bac13;
              if (cmdcount < (int)(uint)local_1ff8.buf) goto LAB_001bac13;
              pcVar6 = commands[(int)(uint)local_1ff8.buf];
              pbVar7 = (byte *)next_log_token();
              if (pbVar7 == (byte *)0x0) goto LAB_001bacbc;
              bVar3 = *pbVar7;
              if (bVar3 < 0x6f) {
                if (bVar3 == 100) {
                  local_2128.argtype = 4;
                  pcVar8 = "d:%d";
LAB_001ba99a:
                  iVar4 = __isoc99_sscanf(pbVar7,pcVar8,&local_2128.field_1);
                  if (iVar4 != 1) {
LAB_001bacbc:
                    parse_error("Bad command argument");
                  }
                }
                else {
                  if (bVar3 != 0x6e) {
LAB_001bacf8:
                    parse_error("unrecognized arg type");
                  }
                  local_2128.argtype = 2;
                }
              }
              else {
                if (bVar3 == 0x6f) {
                  local_2128.argtype = 0x10;
                  pcVar8 = "o:%c";
                  goto LAB_001ba99a;
                }
                if (bVar3 != 0x70) goto LAB_001bacf8;
                local_2128.argtype = 8;
                iVar4 = __isoc99_sscanf(pbVar7,"p:%hx:%hx",&local_2128.field_1,
                                        (undefined1 *)((long)&local_2128.field_1 + 2));
                if (iVar4 != 2) goto LAB_001bacbc;
              }
              iVar4 = get_command_idx(pcVar6);
              command_input(iVar4,local_20fc,&local_2128);
            }
            uVar21 = uVar21 & 0xff;
            if (cVar17 == '\0') {
              uVar21 = 1;
            }
            goto LAB_001baa2c;
          }
          if (bVar3 == 0x54) {
            iVar4 = __isoc99_sscanf(__ptr,"TZ%d",&replay_timezone);
            if (iVar4 != 1) {
              parse_error("Bad timezone offset data.");
            }
          }
          else if ((bVar3 == 0x7e) && (bVar22 || cVar16 == '\0')) {
            pcVar6 = next_log_token();
            if ((pcVar6 != (char *)0x0) && (loginfo.diffs_are_invalid == '\0')) {
              local_2108 = uVar21;
              if ((*pcVar6 != 'f') || (pcVar6[1] != ':')) {
                parse_error("Error: incorrect binary diff format.\n");
              }
              iVar4 = base64_strlen(pcVar6 + 2);
              pbVar7 = (byte *)calloc(1,(long)(iVar4 + 2));
              base64_decode(pcVar6 + 2,(char *)pbVar7);
              mnew(&local_1ff8,(memfile *)0x0);
              bVar3 = *pbVar7;
              bVar1 = pbVar7[1];
              local_2120 = pbVar7;
              if (bVar3 != 0 || bVar1 != 0) {
                iVar18 = 0;
                do {
                  uVar10 = (bVar1 & 0x3f) << 8;
                  uVar5 = bVar3 | uVar10;
                  uVar21 = (uint)(bVar1 >> 6);
                  if (uVar21 - 1 < 2) {
                    iVar11 = local_1ff8.pos + uVar5;
                    if (local_1ff8.len < iVar11) {
                      iVar13 = local_1ff8.len + 0x1000U;
                      if ((int)(local_1ff8.len + 0x1000U) < iVar11) {
                        iVar13 = iVar11;
                      }
                      local_1ff8.len =
                           local_1ff8.len + (~local_1ff8.len + iVar13 & 0xfffff000U) + 0x1000;
                      local_1ff8.buf = (char *)realloc(local_1ff8.buf,(long)local_1ff8.len);
                    }
                    if (uVar21 == 1) {
                      if (diff_base.pos < (int)(uVar5 + iVar18)) {
                        free(local_2120);
                        mfree(&local_1ff8);
                        parse_error("binary diff reads past EOF");
                      }
                      memcpy(local_1ff8.buf + local_1ff8.pos,diff_base.buf + iVar18,(ulong)uVar5);
                      local_1ff8.pos = local_1ff8.pos + uVar5;
                      pbVar7 = pbVar7 + 2;
                      iVar18 = uVar5 + iVar18;
                    }
                    else {
                      pbVar7 = pbVar7 + 2;
                      uVar19 = (ulong)uVar5;
                      if ((long)iVar4 < (long)(pbVar7 + (uVar19 - (long)local_2120))) {
                        free(local_2120);
                        mfree(&local_1ff8);
                        parse_error("binary diff ends unexpectedly");
                      }
                      memcpy(local_1ff8.buf + local_1ff8.pos,pbVar7,uVar19);
                      local_1ff8.pos = local_1ff8.pos + uVar5;
                      pbVar7 = pbVar7 + uVar19;
                      iVar18 = iVar18 + uVar5;
                    }
                  }
                  else {
                    if (uVar21 != 0) {
                      free(local_2120);
                      mfree(&local_1ff8);
                      parse_error("unknown command in binary diff");
                    }
                    uVar21 = uVar5 - 0x4000;
                    if (uVar10 < 0x2000) {
                      uVar21 = uVar5;
                    }
                    if (iVar18 < (int)uVar21) {
                      free(local_2120);
                      mfree(&local_1ff8);
                      parse_error("diff seeks past start of file");
                    }
                    pbVar7 = pbVar7 + 2;
                    iVar18 = iVar18 - uVar21;
                  }
                  bVar3 = *pbVar7;
                  bVar1 = pbVar7[1];
                } while (bVar1 != 0 || bVar3 != 0);
              }
              uVar21 = local_2108;
              uVar19 = (ulong)local_2114;
              if ((char)local_2114 == '\0') {
                if ((char)local_2100 == '\0') {
                  mfree(&diff_base);
                  mnew(&diff_base,(memfile *)0x0);
                  if (loginfo.cmds_are_invalid == '\0') {
                    savegame(&diff_base);
                  }
                  iVar18 = local_1ff8.pos;
                  iVar4 = diff_base.pos;
                  uVar15 = (ulong)(uint)diff_base.pos;
                  if ((diff_base.pos == local_1ff8.pos) &&
                     (iVar11 = bcmp(diff_base.buf,local_1ff8.buf,(long)diff_base.pos), iVar11 == 0))
                  {
                    mfree(&local_1ff8);
                  }
                  else {
                    if (loginfo.cmds_are_invalid == '\0' && iVar18 == iVar4) {
                      local_20f8[0].tagdata = 99;
                      local_20f8[0].tagtype = MTAG_START;
                      local_20f8[0].pos = 0;
                      if (0 < iVar4) {
                        uVar12 = 0;
LAB_001bab17:
                        if (local_1ff8.buf[uVar12] == diff_base.buf[uVar12]) goto code_r0x001bab21;
                        lVar14 = 0;
                        pmVar9 = local_20f8;
                        do {
                          for (pmVar20 = diff_base.tags[lVar14]; pmVar20 != (memfile_tag *)0x0;
                              pmVar20 = pmVar20->next) {
                            if ((pmVar20->pos <= (int)uVar12) && (pmVar9->pos <= pmVar20->pos)) {
                              pmVar9 = pmVar20;
                            }
                          }
                          lVar14 = lVar14 + 1;
                        } while (lVar14 != 0x3f1);
                        raw_printf("desync between recording and save at tag (%d, %ld) + %d bytes",
                                   (ulong)pmVar9->tagtype,pmVar9->tagdata,
                                   (ulong)(uint)((int)uVar12 - pmVar9->pos));
                      }
                    }
                    else if (loginfo.cmds_are_invalid == '\0') {
                      raw_printf("desync between recording (length %d) and recorded save (length %d)"
                                 ,(ulong)(uint)iVar4,(ulong)(uint)iVar18);
                    }
LAB_001bab8c:
                    loginfo.out_of_sync = '\x01';
                    mfree(&diff_base);
                    memcpy(&diff_base,&local_1ff8,0x1fc0);
                    replay_sync_save();
                    if (loginfo.cmds_are_invalid == '\0' && loginfo.diffs_are_invalid == '\0') {
                      loginfo.cmds_are_invalid = '\x01';
                      raw_printf(
                                "The recorded commands seem to be invalid.  Replay will use diffs instead."
                                );
                    }
                  }
                }
                else {
                  loginfo.out_of_sync = '\x01';
                  mfree(&diff_base);
                  memcpy(&diff_base,&local_1ff8,0x1fc0);
                }
              }
              else {
                mfree(&diff_base);
                memcpy(&diff_base,&local_1ff8,0x1fc0);
                uVar21 = local_2108;
              }
              free(local_2120);
            }
            if ((char)local_2104 != '\0') goto LAB_001babeb;
          }
        }
LAB_001baa2c:
        free(__ptr);
        pcVar6 = next_log_token();
        if ((pcVar6 == (char *)0x0) || (__ptr = (byte *)strdup(pcVar6), __ptr == (byte *)0x0))
        goto LAB_001babeb;
      } while( true );
    }
  }
  uVar21 = 0;
LAB_001babeb:
  pnVar2 = birth_options;
  birth_options = active_birth_options;
  active_birth_options = pnVar2;
  return (boolean)uVar21;
code_r0x001bab21:
  uVar12 = uVar12 + 1;
  if (uVar15 == uVar12) goto LAB_001bab8c;
  goto LAB_001bab17;
}

Assistant:

boolean replay_run_cmdloop(boolean optonly, boolean singlestep, boolean fast)
{
    char *cmd, *token;
    int count, cmdidx;
    struct nh_cmd_arg cmdarg;
    struct nh_option_desc *tmp;
    boolean did_action = FALSE;
    
    /* the log contains the birth options that are required for this game,
     * so nh_set_option calls during the replay must change active_birth_options */
    tmp = birth_options;
    birth_options = active_birth_options;
    active_birth_options = tmp;

    token = strdupnull(next_log_token());

    while (token) {
	switch (token[0]) {
	    case '!': /* Option */
		replay_read_option(token);
		break;
		
	    case 'T': /* timezone offset */
		replay_read_timezone(token);
		break;
		
	    case '>': /* command */
		if (!optonly && !loginfo.cmds_are_invalid) {
		    replay_read_command(token, &cmd, &count, &cmdarg);
		    cmdidx = get_command_idx(cmd);
		    command_input(cmdidx, count, &cmdarg);
		}
		if (!optonly)
		    did_action = TRUE;
		break;
		
	    case '<': /* a command result */
		if (!optonly)
		    replay_check_cmdresult(token);
		break;

	    case '~': /* a diff */
		if (!optonly || singlestep)
		    replay_check_diff(next_log_token(), optonly, fast);
		if (singlestep)
		    goto out;
		break;

	    case '-': /* a message */
		/* We want to display the welcome messages in the
		 * new-game sequence even if recovering from diffs. */
		if (program_state.viewing && loginfo.cmds_are_invalid && !optonly)
		    replay_check_msg(token);
		break;
	}
	free(token);
	token = strdupnull(next_log_token());
    }

out:
    /* return the birth options to normal */
    tmp = birth_options;
    birth_options = active_birth_options;
    active_birth_options = tmp;
    
    return did_action;
}